

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws-cache-ttl.c
# Opt level: O0

void lws_cache_destroy(lws_cache_ttl_lru **_cache)

{
  lws_cache_ttl_lru *plVar1;
  lws_cache_ttl_lru_t *cache;
  lws_cache_ttl_lru **_cache_local;
  
  plVar1 = *_cache;
  if (plVar1 != (lws_cache_ttl_lru *)0x0) {
    if (((plVar1->info).ops)->destroy == (_func_void_lws_cache_ttl_lru_ptr_ptr *)0x0) {
      __assert_fail("cache->info.ops->destroy",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/misc/cache-ttl/lws-cache-ttl.c"
                    ,0x127,"void lws_cache_destroy(struct lws_cache_ttl_lru **)");
    }
    lws_sul_cancel(&plVar1->sul);
    (*((plVar1->info).ops)->destroy)(_cache);
  }
  return;
}

Assistant:

void
lws_cache_destroy(struct lws_cache_ttl_lru **_cache)
{
	lws_cache_ttl_lru_t *cache = *_cache;

	if (!cache)
		return;

	assert(cache->info.ops->destroy);

	lws_sul_cancel(&cache->sul);

	cache->info.ops->destroy(_cache);
}